

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O3

void __thiscall
MeanField::CPU::CRF::CRF
          (CRF *this,int width,int height,int dimensions,float spatialSD,float bilateralSpatialSD,
          float bilateralIntensitySD,bool separable)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float *pfVar3;
  float *pfVar4;
  float *__s;
  float *__s_00;
  ulong uVar5;
  uint uVar6;
  int i;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  (this->super_CRF)._vptr_CRF = (_func_int **)&PTR_filterGaussian_001089c0;
  this->width = width;
  this->height = height;
  this->dimensions = dimensions;
  this->spatialSD = spatialSD;
  this->bilateralSpatialSD = bilateralSpatialSD;
  this->bilateralIntensitySD = bilateralIntensitySD;
  this->spatialWeight = 1.0;
  this->bilateralWeight = 1.0;
  this->separable = separable;
  uVar6 = height * width * dimensions;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)uVar6) {
    uVar5 = (ulong)uVar6 * 4;
  }
  pfVar3 = (float *)operator_new__(uVar5);
  memset(pfVar3,0,uVar5);
  (this->QDistribution)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar3;
  pfVar3 = (float *)operator_new__(uVar5);
  memset(pfVar3,0,uVar5);
  (this->QDistributionTmp)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar3;
  uVar8 = (ulong)(uint)(dimensions * dimensions) << 2;
  pfVar3 = (float *)operator_new__(uVar8);
  memset(pfVar3,0,uVar8);
  (this->pottsModel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar3;
  pfVar4 = (float *)operator_new__(uVar5);
  memset(pfVar4,0,uVar5);
  (this->gaussianOut)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
  pfVar4 = (float *)operator_new__(uVar5);
  memset(pfVar4,0,uVar5);
  (this->bilateralOut)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
  pfVar4 = (float *)operator_new__(uVar5);
  memset(pfVar4,0,uVar5);
  (this->aggregatedFilters)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
  pfVar4 = (float *)operator_new__(uVar5);
  memset(pfVar4,0,uVar5);
  (this->filterOutTmp)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
  pfVar4 = (float *)operator_new__(0x400);
  memset(pfVar4,0,0x400);
  (this->spatialKernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar4;
  __s = (float *)operator_new__(0x400);
  memset(__s,0,0x400);
  (this->bilateralSpatialKernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
  _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
  __s_00 = (float *)operator_new__(0x400);
  memset(__s_00,0,0x400);
  (this->bilateralIntensityKernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
  _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = __s_00;
  auVar2 = _DAT_00106040;
  auVar1 = _DAT_00106030;
  if (0 < dimensions) {
    uVar5 = (ulong)(uint)dimensions;
    lVar7 = uVar5 - 1;
    auVar11._8_4_ = (int)lVar7;
    auVar11._0_8_ = lVar7;
    auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
    pfVar3 = pfVar3 + 1;
    uVar8 = 0;
    auVar11 = auVar11 ^ _DAT_00106040;
    do {
      uVar9 = 0;
      auVar12 = auVar1;
      do {
        auVar13 = auVar12 ^ auVar2;
        if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                    auVar11._4_4_ < auVar13._4_4_) & 1)) {
          fVar10 = -1.0;
          if (uVar8 != uVar9) {
            fVar10 = 0.0;
          }
          pfVar3[uVar9 - 1] = fVar10;
        }
        if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
            auVar13._12_4_ <= auVar11._12_4_) {
          fVar10 = -1.0;
          if (uVar8 - 1 != uVar9) {
            fVar10 = 0.0;
          }
          pfVar3[uVar9] = fVar10;
        }
        uVar9 = uVar9 + 2;
        lVar7 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 2;
        auVar12._8_8_ = lVar7 + 2;
      } while ((dimensions + 1U & 0xfffffffe) != uVar9);
      uVar8 = uVar8 + 1;
      pfVar3 = pfVar3 + uVar5;
    } while (uVar8 != uVar5);
  }
  lVar7 = 0;
  do {
    fVar10 = expf((float)-((int)lVar7 * (int)lVar7) / ((spatialSD + spatialSD) * spatialSD));
    pfVar4[lVar7] = fVar10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  lVar7 = 0;
  do {
    fVar10 = expf((float)-((int)lVar7 * (int)lVar7) /
                  ((bilateralSpatialSD + bilateralSpatialSD) * bilateralSpatialSD));
    __s[lVar7] = fVar10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  lVar7 = 0;
  do {
    fVar10 = expf((float)-((int)lVar7 * (int)lVar7) /
                  ((bilateralIntensitySD + bilateralIntensitySD) * bilateralIntensitySD));
    __s_00[lVar7] = fVar10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x100);
  return;
}

Assistant:

CRF::CRF(int width, int height, int dimensions, float spatialSD,
    float bilateralSpatialSD, float bilateralIntensitySD, bool separable) :
    width(width), height(height), dimensions(dimensions),
    spatialWeight(1.0), bilateralWeight(1.0),
    spatialSD(spatialSD), bilateralSpatialSD(bilateralSpatialSD),
    bilateralIntensitySD(bilateralIntensitySD),
    separable(separable),
    QDistribution(new float[width*height*dimensions]()),
    QDistributionTmp(new float[width*height*dimensions]()),
    pottsModel(new float[dimensions*dimensions]()),
    gaussianOut(new float[width*height*dimensions]()),
    bilateralOut(new float[width*height*dimensions]()),
    aggregatedFilters(new float[width*height*dimensions]()),
    filterOutTmp(new float[width*height*dimensions]()),
    spatialKernel(new float[KERNEL_SIZE]()),
    bilateralSpatialKernel(new float[KERNEL_SIZE]()),
    bilateralIntensityKernel(new float[KERNEL_SIZE]()) {

    //Initialise potts model.
    for (int i = 0; i < dimensions; i++) {
        for (int j = 0; j < dimensions; j++) {
            pottsModel[i*dimensions + j] = (i == j) ? -1.0 : 0.0;
        }
    }

    //Initialise kernels.
    generateGaussianKernel(spatialKernel.get(), KERNEL_SIZE, spatialSD);
    generateGaussianKernel(bilateralSpatialKernel.get(), KERNEL_SIZE, bilateralSpatialSD);
    generateGaussianKernel(bilateralIntensityKernel.get(), KERNEL_SIZE, bilateralIntensitySD);
}